

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O1

TextureCubemap * LoadTextureCubemap(TextureCubemap *__return_storage_ptr__,Image image,int layout)

{
  undefined1 auVar1 [16];
  void *__ptr;
  int iVar2;
  int iVar3;
  long lVar4;
  float *pfVar5;
  int i;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  Rectangle srcRec;
  float fStack_dc;
  undefined8 local_d8;
  float afStack_d0 [2];
  undefined8 local_c8;
  undefined8 uStack_c0;
  ulong local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  Image local_78;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  
  __return_storage_ptr__->id = 0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->mipmaps = 0;
  __return_storage_ptr__->format = 0;
  if (layout == 0) {
    if (image.height < image.width) {
      iVar3 = image.width / 6;
      iVar2 = 2;
      if (iVar3 != image.height) {
        iVar3 = image.width + 3;
        if (-1 < image.width) {
          iVar3 = image.width;
        }
        iVar3 = iVar3 >> 2;
        iVar2 = 4;
        if (iVar3 != image.height / 3) {
          layout = 0;
          iVar2 = 5;
          if (image.width < (int)((float)image.height * 1.85)) goto LAB_0014350f;
        }
      }
LAB_0014350a:
      layout = iVar2;
      __return_storage_ptr__->width = iVar3;
    }
    else {
      layout = 0;
      if (image.width < image.height) {
        iVar3 = image.height / 6;
        iVar2 = 1;
        if (iVar3 != image.width) {
          iVar3 = image.width / 3;
          iVar6 = image.height + 3;
          if (-1 < image.height) {
            iVar6 = image.height;
          }
          iVar2 = 3;
          if (iVar3 != iVar6 >> 2) goto LAB_0014350f;
        }
        goto LAB_0014350a;
      }
    }
LAB_0014350f:
    __return_storage_ptr__->height = __return_storage_ptr__->width;
  }
  if (layout == 0) {
    TraceLog(4,"IMAGE: Failed to detect cubemap image layout");
    return __return_storage_ptr__;
  }
  iVar3 = __return_storage_ptr__->width;
  local_78.data = (void *)0x0;
  local_78.width = 0;
  local_78.height = 0;
  local_78.mipmaps = 0;
  local_78.format = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  afStack_d0[0] = 0.0;
  afStack_d0[1] = 0.0;
  fVar9 = (float)iVar3;
  lVar4 = 0xc;
  do {
    *(undefined8 *)(&stack0xffffffffffffff1c + lVar4) = 0;
    *(float *)((long)&fStack_dc + lVar4) = fVar9;
    *(float *)((long)&local_d8 + lVar4) = fVar9;
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x6c);
  switch(layout) {
  case 1:
    local_78.mipmaps = (int)image._16_8_;
    local_78.format = SUB84(image._16_8_,4);
    local_78.data = image.data;
    local_78.width = (int)image._8_8_;
    local_78.height = SUB84(image._8_8_,4);
    pfVar5 = (float *)((long)&local_d8 + 4);
    lVar4 = 0;
    do {
      *pfVar5 = (float)(int)lVar4 * (float)iVar3;
      lVar4 = lVar4 + 1;
      pfVar5 = pfVar5 + 4;
    } while (lVar4 != 6);
    goto switchD_0014359b_caseD_5;
  case 2:
    pfVar5 = (float *)&local_d8;
    lVar4 = 0;
    do {
      *pfVar5 = (float)(int)lVar4 * (float)iVar3;
      lVar4 = lVar4 + 1;
      pfVar5 = pfVar5 + 4;
    } while (lVar4 != 6);
    break;
  case 3:
    fVar10 = (float)iVar3;
    local_d8 = CONCAT44(fVar10,fVar10);
    local_c8 = CONCAT44(fVar10 * 3.0,fVar10);
    fVar9 = fVar10 + fVar10;
    local_a8 = CONCAT44(fVar9,fVar10);
    local_98 = (ulong)(uint)fVar10 << 0x20;
    goto LAB_001436d3;
  case 4:
    local_d8 = CONCAT44(fVar9,fVar9 + fVar9);
    local_c8 = (ulong)(uint)fVar9 << 0x20;
    local_a8 = CONCAT44(fVar9 + fVar9,fVar9);
    local_98 = CONCAT44(fVar9,fVar9);
    fVar9 = fVar9 * 3.0;
LAB_001436d3:
    local_b8 = (ulong)(uint)(float)iVar3;
    local_88 = CONCAT44((float)iVar3,fVar9);
    break;
  case 5:
    goto switchD_0014359b_caseD_5;
  }
  uVar8 = iVar3 * 6 * iVar3;
  local_78.data = calloc((long)(int)uVar8,4);
  if (0 < (int)uVar8) {
    uVar7 = 0;
    do {
      *(undefined4 *)((long)local_78.data + uVar7 * 4) = 0xffff00ff;
      uVar7 = uVar7 + 1;
    } while (uVar8 != uVar7);
  }
  local_78.height = iVar3 * 6;
  local_78.width = iVar3;
  local_78.mipmaps = 1;
  local_78.format = 7;
  ImageFormat(&local_78,image.format);
switchD_0014359b_caseD_5:
  local_58 = (float)iVar3;
  local_48 = ZEXT416((uint)local_58);
  fStack_54 = local_58;
  fStack_50 = local_58;
  fStack_4c = local_58;
  pfVar5 = afStack_d0;
  lVar4 = 0;
  do {
    auVar1._8_4_ = fStack_54;
    auVar1._4_4_ = local_58;
    srcRec.width = pfVar5[0];
    srcRec.height = pfVar5[1];
    srcRec.x = pfVar5[-2];
    srcRec.y = pfVar5[-1];
    auVar1._0_4_ = (float)(int)lVar4 * (float)local_48._0_4_;
    auVar1._12_4_ = 0;
    ImageDraw(&local_78,image,srcRec,(Rectangle)(auVar1 << 0x20),(Color)0xffffffff);
    __ptr = local_78.data;
    lVar4 = lVar4 + 1;
    pfVar5 = pfVar5 + 4;
  } while (lVar4 != 6);
  uVar8 = rlLoadTextureCubemap(local_78.data,iVar3,local_78.format);
  __return_storage_ptr__->id = uVar8;
  if (uVar8 == 0) {
    TraceLog(4,"IMAGE: Failed to load cubemap image");
  }
  free(__ptr);
  return __return_storage_ptr__;
}

Assistant:

TextureCubemap LoadTextureCubemap(Image image, int layout)
{
    TextureCubemap cubemap = { 0 };

    if (layout == CUBEMAP_LAYOUT_AUTO_DETECT)      // Try to automatically guess layout type
    {
        // Check image width/height to determine the type of cubemap provided
        if (image.width > image.height)
        {
            if ((image.width/6) == image.height) { layout = CUBEMAP_LAYOUT_LINE_HORIZONTAL; cubemap.width = image.width/6; }
            else if ((image.width/4) == (image.height/3)) { layout = CUBEMAP_LAYOUT_CROSS_FOUR_BY_THREE; cubemap.width = image.width/4; }
            else if (image.width >= (int)((float)image.height*1.85f)) { layout = CUBEMAP_LAYOUT_PANORAMA; cubemap.width = image.width/4; }
        }
        else if (image.height > image.width)
        {
            if ((image.height/6) == image.width) { layout = CUBEMAP_LAYOUT_LINE_VERTICAL; cubemap.width = image.height/6; }
            else if ((image.width/3) == (image.height/4)) { layout = CUBEMAP_LAYOUT_CROSS_THREE_BY_FOUR; cubemap.width = image.width/3; }
        }

        cubemap.height = cubemap.width;
    }

    if (layout != CUBEMAP_LAYOUT_AUTO_DETECT)
    {
        int size = cubemap.width;

        Image faces = { 0 };                // Vertical column image
        Rectangle faceRecs[6] = { 0 };      // Face source rectangles
        for (int i = 0; i < 6; i++) faceRecs[i] = (Rectangle){ 0, 0, (float)size, (float)size };

        if (layout == CUBEMAP_LAYOUT_LINE_VERTICAL)
        {
            faces = image;
            for (int i = 0; i < 6; i++) faceRecs[i].y = (float)size*i;
        }
        else if (layout == CUBEMAP_LAYOUT_PANORAMA)
        {
            // TODO: Convert panorama image to square faces...
            // Ref: https://github.com/denivip/panorama/blob/master/panorama.cpp
        }
        else
        {
            if (layout == CUBEMAP_LAYOUT_LINE_HORIZONTAL) for (int i = 0; i < 6; i++) faceRecs[i].x = (float)size*i;
            else if (layout == CUBEMAP_LAYOUT_CROSS_THREE_BY_FOUR)
            {
                faceRecs[0].x = (float)size; faceRecs[0].y = (float)size;
                faceRecs[1].x = (float)size; faceRecs[1].y = (float)size*3;
                faceRecs[2].x = (float)size; faceRecs[2].y = 0;
                faceRecs[3].x = (float)size; faceRecs[3].y = (float)size*2;
                faceRecs[4].x = 0; faceRecs[4].y = (float)size;
                faceRecs[5].x = (float)size*2; faceRecs[5].y = (float)size;
            }
            else if (layout == CUBEMAP_LAYOUT_CROSS_FOUR_BY_THREE)
            {
                faceRecs[0].x = (float)size*2; faceRecs[0].y = (float)size;
                faceRecs[1].x = 0; faceRecs[1].y = (float)size;
                faceRecs[2].x = (float)size; faceRecs[2].y = 0;
                faceRecs[3].x = (float)size; faceRecs[3].y = (float)size*2;
                faceRecs[4].x = (float)size; faceRecs[4].y = (float)size;
                faceRecs[5].x = (float)size*3; faceRecs[5].y = (float)size;
            }

            // Convert image data to 6 faces in a vertical column, that's the optimum layout for loading
            faces = GenImageColor(size, size*6, MAGENTA);
            ImageFormat(&faces, image.format);

            // TODO: Image formating does not work with compressed textures!
        }

        for (int i = 0; i < 6; i++) ImageDraw(&faces, image, faceRecs[i], (Rectangle){ 0, (float)size*i, (float)size, (float)size }, WHITE);

        cubemap.id = rlLoadTextureCubemap(faces.data, size, faces.format);
        if (cubemap.id == 0) TRACELOG(LOG_WARNING, "IMAGE: Failed to load cubemap image");

        UnloadImage(faces);
    }
    else TRACELOG(LOG_WARNING, "IMAGE: Failed to detect cubemap image layout");

    return cubemap;
}